

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

char * TagToString(Node *tag,char *buf,size_t count)

{
  NodeType NVar1;
  Bool BVar2;
  uint uVar3;
  undefined4 extraout_var;
  ctmbstr ptVar4;
  ctmbstr format;
  
  *buf = '\0';
  if (tag == (Node *)0x0) goto LAB_001546ba;
  BVar2 = prvTidynodeIsElement(tag);
  if (BVar2 == no) {
    NVar1 = tag->type;
    if ((int)NVar1 < 6) {
      if (NVar1 == DocTypeTag) {
        prvTidytmbsnprintf(buf,count,"<!DOCTYPE>");
        goto LAB_001546ba;
      }
      if (NVar1 != TextNode) goto LAB_001546f8;
      uVar3 = 0x1fc;
    }
    else {
      if (NVar1 != XmlDecl) {
        if (NVar1 == EndTag) {
          ptVar4 = tag->element;
          format = "</%s>";
        }
        else {
LAB_001546f8:
          ptVar4 = tag->element;
          if (ptVar4 == (ctmbstr)0x0) goto LAB_001546ba;
          format = anon_var_dwarf_53054 + 0x16;
        }
        goto LAB_001546b3;
      }
      uVar3 = 0x1ff;
    }
    ptVar4 = tidyLocalizedString(uVar3);
    format = anon_var_dwarf_53054 + 0x16;
  }
  else {
    ptVar4 = tag->element;
    format = "<%s>";
  }
LAB_001546b3:
  prvTidytmbsnprintf(buf,count,format,ptVar4);
LAB_001546ba:
  uVar3 = prvTidytmbstrlen(buf);
  return (char *)CONCAT44(extraout_var,uVar3);
}

Assistant:

static char* TagToString(Node* tag, char* buf, size_t count)
{
    *buf = 0;
    if (tag)
    {
        if (TY_(nodeIsElement)(tag))
            TY_(tmbsnprintf)(buf, count, "<%s>", tag->element);
        else if (tag->type == EndTag)
            TY_(tmbsnprintf)(buf, count, "</%s>", tag->element);
        else if (tag->type == DocTypeTag)
            TY_(tmbsnprintf)(buf, count, "<!DOCTYPE>");
        else if (tag->type == TextNode)
            TY_(tmbsnprintf)(buf, count, "%s", tidyLocalizedString(STRING_PLAIN_TEXT));
        else if (tag->type == XmlDecl)
            TY_(tmbsnprintf)(buf, count, "%s", tidyLocalizedString(STRING_XML_DECLARATION));
        else if (tag->element)
            TY_(tmbsnprintf)(buf, count, "%s", tag->element);
    }
    return buf + TY_(tmbstrlen)(buf);
}